

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O2

int history_def_last(void *p,HistEvent *ev)

{
  undefined8 *puVar1;
  char *pcVar2;
  
  puVar1 = *(undefined8 **)((long)p + 0x20);
  *(undefined8 **)((long)p + 0x28) = puVar1;
  if (puVar1 != (undefined8 *)p) {
    pcVar2 = (char *)puVar1[1];
    *(undefined8 *)ev = *puVar1;
    ev->str = pcVar2;
    return 0;
  }
  ev->num = 4;
  ev->str = "last event not found";
  return -1;
}

Assistant:

static int
history_def_last(void *p, TYPE(HistEvent) *ev)
{
	history_t *h = (history_t *) p;

	h->cursor = h->list.prev;
	if (h->cursor != &h->list)
		*ev = h->cursor->ev;
	else {
		he_seterrev(ev, _HE_LAST_NOTFOUND);
		return -1;
	}

	return 0;
}